

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char>
fmt::v7::detail::
write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::float_writer<char>>
          (buffer_appender<char> out,basic_format_specs<char> *specs,size_t size,size_t width,
          float_writer<char> *f)

{
  type tVar1;
  buffer_appender<char> bVar2;
  ulong n;
  ulong uVar3;
  
  tVar1 = to_unsigned<int>(specs->width);
  uVar3 = 0;
  if (width <= tVar1) {
    uVar3 = tVar1 - width;
  }
  n = uVar3 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                         (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
  bVar2 = reserve<char>(out,(specs->fill).size_ * uVar3 + size);
  bVar2 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar2,n,&specs->fill);
  bVar2 = float_writer<char>::operator()(f,bVar2);
  bVar2 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar2,uVar3 - n,&specs->fill);
  return (buffer_appender<char>)
         bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

inline OutputIt write_padded(OutputIt out,
                             const basic_format_specs<Char>& specs, size_t size,
                             size_t width, const F& f) {
  static_assert(align == align::left || align == align::right, "");
  unsigned spec_width = to_unsigned(specs.width);
  size_t padding = spec_width > width ? spec_width - width : 0;
  auto* shifts = align == align::left ? data::left_padding_shifts
                                      : data::right_padding_shifts;
  size_t left_padding = padding >> shifts[specs.align];
  auto it = reserve(out, size + padding * specs.fill.size());
  it = fill(it, left_padding, specs.fill);
  it = f(it);
  it = fill(it, padding - left_padding, specs.fill);
  return base_iterator(out, it);
}